

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O2

void __thiscall PressDelayHandler::PressDelayHandler(PressDelayHandler *this,QObject *parent)

{
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_007ef8a0;
  (this->pressDelayTimer).m_id = Invalid;
  (this->pressDelayEvent).d = (QMouseEvent *)0x0;
  this->sendingEvent = false;
  *(undefined8 *)&this->mouseButton = 0;
  *(undefined8 *)((long)&(this->mouseTarget).wp.d + 4) = 0;
  *(undefined8 *)((long)&(this->mouseTarget).wp.value + 4) = 0;
  return;
}

Assistant:

PressDelayHandler(QObject *parent = nullptr)
        : QObject(parent)
        , sendingEvent(false)
        , mouseButton(Qt::NoButton)
        , mouseTarget(nullptr)
        , mouseEventSource(Qt::MouseEventNotSynthesized)
    { }